

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementScopedU<Js::OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  ScriptContext *this;
  PropertyRecord *this_00;
  char16 *pcVar3;
  undefined4 *puVar4;
  PropertyRecord *pPropertyName;
  ScriptContext *scriptContext;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementScopedU<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  this = FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
  propertyId = FunctionBody::GetReferencedPropertyId(dumpFunction,(uint)data->PropertyIdIndex);
  this_00 = ScriptContext::GetPropertyName(this,propertyId);
  if (op == LdElemUndefScoped) {
    pcVar3 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" %s = undefined, R%d",pcVar3,1);
  }
  else if ((ushort)(op - InitUndeclConsoleLetFld) < 2) {
    pcVar3 = PropertyRecord::GetBuffer(this_00);
    Output::Print(L" %s = undefined",pcVar3);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x240,"(false)","Unknown OpCode for ElementScopedU");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementScopedU(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        ScriptContext* scriptContext = dumpFunction->GetScriptContext();
        PropertyRecord const * pPropertyName = scriptContext->GetPropertyName(
            dumpFunction->GetReferencedPropertyId(data->PropertyIdIndex));
        switch (op)
        {
            case OpCode::LdElemUndefScoped:
            {
                Output::Print(_u(" %s = undefined, R%d"), pPropertyName->GetBuffer(), Js::FunctionBody::RootObjectRegSlot);
                break;
            }
            case OpCode::InitUndeclConsoleLetFld:
            case OpCode::InitUndeclConsoleConstFld:
            {
                Output::Print(_u(" %s = undefined"), pPropertyName->GetBuffer());
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for ElementScopedU");
                break;
            }
        }
    }